

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# func.cpp
# Opt level: O2

double lognchoosek(int nn,int k)

{
  int __x;
  int iVar1;
  __type_conflict _Var2;
  __type_conflict _Var3;
  undefined8 local_20;
  
  iVar1 = 0;
  if (0 < k) {
    iVar1 = k;
  }
  local_20 = 0.0;
  for (__x = 1; __x - iVar1 != 1; __x = __x + 1) {
    _Var2 = std::log<int>((nn - k) + __x);
    _Var3 = std::log<int>(__x);
    local_20 = (local_20 + _Var2) - _Var3;
  }
  return local_20;
}

Assistant:

double lognchoosek(int nn, int k)
{
    double s=0;
    for (int i=1; i<=k; i++) s = s + log(nn-k+i)-log(i);
    return s;
}